

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O1

bool bssl::anon_unknown_0::DecodeBase64
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *out,char *in)

{
  uint8_t *out_00;
  size_type max_out;
  int iVar1;
  size_t sVar2;
  size_t len;
  size_type local_30;
  
  sVar2 = strlen(in);
  iVar1 = EVP_DecodedLength(&local_30,sVar2);
  if (iVar1 == 0) {
    _GLOBAL__N_1::DecodeBase64();
  }
  else {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,local_30);
    max_out = local_30;
    out_00 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar2 = strlen(in);
    iVar1 = EVP_DecodeBase64(out_00,&local_30,max_out,(uint8_t *)in,sVar2);
    if (iVar1 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out,local_30);
      return true;
    }
    _GLOBAL__N_1::DecodeBase64();
  }
  return false;
}

Assistant:

static bool DecodeBase64(std::vector<uint8_t> *out, const char *in) {
  size_t len;
  if (!EVP_DecodedLength(&len, strlen(in))) {
    fprintf(stderr, "EVP_DecodedLength failed\n");
    return false;
  }

  out->resize(len);
  if (!EVP_DecodeBase64(out->data(), &len, len, (const uint8_t *)in,
                        strlen(in))) {
    fprintf(stderr, "EVP_DecodeBase64 failed\n");
    return false;
  }
  out->resize(len);
  return true;
}